

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

vector map_remove_all(map m,map_key key)

{
  int iVar1;
  comparable_callback compare_cb;
  void **ppvVar2;
  void *key_00;
  bucket in_RSI;
  long *in_RDI;
  vector v;
  bucket b;
  size_t size;
  size_t iterator;
  size_t index;
  map_hash h;
  map in_stack_ffffffffffffffc8;
  void **value;
  vector local_8;
  
  if ((in_RDI == (long *)0x0) || (in_RSI == (bucket)0x0)) {
    log_write_impl_va("metacall",0x159,"map_remove_all",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,3,"Invalid map remove parameters");
    local_8 = (vector)0x0;
  }
  else {
    compare_cb = (comparable_callback)(*(code *)in_RDI[4])(in_RSI);
    key_00 = (void *)((ulong)compare_cb % (ulong)in_RDI[1]);
    local_8 = map_get(in_stack_ffffffffffffffc8,(map_key)(in_RDI[3] + (long)key_00 * 0x18));
    ppvVar2 = (void **)vector_size(local_8);
    if (ppvVar2 == (void **)0x0) {
      log_write_impl_va("metacall",0x169,"map_remove_all",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Invalid map bucket remove: %p",in_RSI);
      vector_destroy((vector)0x1044b0);
      local_8 = (vector)0x0;
    }
    else {
      for (value = (void **)0x0; value < ppvVar2; value = (void **)((long)value + 1)) {
        iVar1 = bucket_remove(in_RSI,compare_cb,key_00,value);
        if (iVar1 != 0) {
          log_write_impl_va("metacall",0x172,"map_remove_all",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                            ,3,"Invalid map bucket remove: %p",in_RSI);
          vector_destroy((vector)0x104539);
          return (vector)0x0;
        }
        *in_RDI = *in_RDI + -1;
      }
      iVar1 = map_bucket_realloc((map)b);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x17c,"map_remove_all",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                          ,3,"Invalid map bucket remove reallocation");
        vector_destroy((vector)0x1045ad);
        local_8 = (vector)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

vector map_remove_all(map m, map_key key)
{
	map_hash h;
	size_t index, iterator, size;
	bucket b;
	vector v = NULL;

	if (m == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map remove parameters");
		return NULL;
	}

	h = m->hash_cb(key);

	index = h % m->capacity;

	b = &m->buckets[index];

	v = map_get(m, key);

	size = vector_size(v);

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove: %p", key);
		vector_destroy(v);
		return NULL;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (bucket_remove(b, m->compare_cb, key, NULL) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove: %p", key);
			vector_destroy(v);
			return NULL;
		}

		--m->count;
	}

	if (map_bucket_realloc(m) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove reallocation");
		vector_destroy(v);
		return NULL;
	}

	return v;
}